

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcCovering::~IfcCovering(IfcCovering *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)this = 0x90ed00;
  *(undefined8 *)&this->field_0x180 = 0x90ee18;
  *(undefined8 *)&this->field_0x88 = 0x90ed28;
  *(undefined8 *)&this->field_0x98 = 0x90ed50;
  *(undefined8 *)&this->field_0xd0 = 0x90ed78;
  *(undefined8 *)&this->field_0x100 = 0x90eda0;
  *(undefined8 *)&this->field_0x138 = 0x90edc8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x90edf0;
  puVar2 = *(undefined1 **)
            &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x10;
  puVar1 = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcCovering,_1UL>).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcElement::~IfcElement((IfcElement *)this,&PTR_construction_vtable_24__0090ee38);
  return;
}

Assistant:

IfcCovering() : Object("IfcCovering") {}